

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

string * ParseEvent_abi_cxx11_(string *__return_storage_ptr__,istream *is)

{
  char cVar1;
  istream *piVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  piVar2 = std::ws<char,std::char_traits<char>>(is);
  cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar2 + -0x18) + (char)piVar2);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            (piVar2,(string *)__return_storage_ptr__,cVar1);
  return __return_storage_ptr__;
}

Assistant:

string ParseEvent(istream& is) {
    string event;
    getline(is >> ws, event);
    return event;
}